

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O0

void __thiscall webrtc::WavWriter::Close(WavWriter *this)

{
  int iVar1;
  FatalMessage local_4d8;
  string *local_360;
  string *_result_2;
  size_t local_1e0;
  uint local_1d4;
  string *local_1d0;
  string *_result_1;
  uint8_t header [44];
  FatalMessage local_190;
  string *local_18;
  string *_result;
  WavWriter *this_local;
  
  _result = (string *)this;
  iVar1 = fseek((FILE *)this->file_handle_,0,0);
  local_18 = rtc::CheckEQImpl_abi_cxx11_(0,iVar1,"0 == fseek(file_handle_, 0, 0)");
  if (local_18 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0xa7,local_18);
    rtc::FatalMessage::stream(&local_190);
    rtc::FatalMessage::~FatalMessage(&local_190);
  }
  WriteWavHeader((uint8_t *)&_result_1,this->num_channels_,this->sample_rate_,kWavFormatPcm,2,
                 this->num_samples_);
  local_1d4 = 1;
  local_1e0 = fwrite(&_result_1,0x2c,1,(FILE *)this->file_handle_);
  local_1d0 = rtc::CheckEQImpl<unsigned_int,unsigned_long>
                        (&local_1d4,&local_1e0,
                         "1u == fwrite(header, kWavHeaderSize, 1, file_handle_)");
  if (local_1d0 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&_result_2,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0xab,local_1d0);
    rtc::FatalMessage::stream((FatalMessage *)&_result_2);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_2);
  }
  iVar1 = fclose((FILE *)this->file_handle_);
  local_360 = rtc::CheckEQImpl_abi_cxx11_(0,iVar1,"0 == fclose(file_handle_)");
  if (local_360 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_4d8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0xac,local_360);
    rtc::FatalMessage::stream(&local_4d8);
    rtc::FatalMessage::~FatalMessage(&local_4d8);
  }
  this->file_handle_ = (FILE *)0x0;
  return;
}

Assistant:

void WavWriter::Close() {
  RTC_CHECK_EQ(0, fseek(file_handle_, 0, SEEK_SET));
  uint8_t header[kWavHeaderSize];
  WriteWavHeader(header, num_channels_, sample_rate_, kWavFormat,
                 kBytesPerSample, num_samples_);
  RTC_CHECK_EQ(1u, fwrite(header, kWavHeaderSize, 1, file_handle_));
  RTC_CHECK_EQ(0, fclose(file_handle_));
  file_handle_ = NULL;
}